

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O1

void Wln_WriteVerInt(FILE *pFile,Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  Wln_Vec_t *pWVar17;
  int *piVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  size_t __size;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  long local_d0;
  char Range [100];
  
  fprintf((FILE *)pFile,"module %s ( ",p->pName);
  fwrite("\n   ",4,1,(FILE *)pFile);
  if (0 < (p->vCis).nSize) {
    Wln_WriteVerIntVec(pFile,p,&p->vCis,3);
    fwrite(",\n   ",5,1,(FILE *)pFile);
  }
  if (0 < (p->vCos).nSize) {
    Wln_WriteVerIntVec(pFile,p,&p->vCos,3);
  }
  uVar22 = 1;
  fwrite("  );\n",5,1,(FILE *)pFile);
  if (1 < (p->vTypes).nSize) {
    local_d0 = 0x18;
    lVar27 = 0x1c;
    do {
      if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
      iVar29 = (p->vRanges).pArray[uVar22];
      if (iVar29 < 0) goto LAB_0038c34b;
      pVVar3 = p->pRanges->vObjs;
      uVar5 = iVar29 * 4;
      if (pVVar3->nSize <= (int)uVar5) goto LAB_0038c34b;
      piVar18 = pVVar3->pArray;
      uVar26 = piVar18[uVar5];
      uVar6 = -uVar26;
      if (0 < (int)uVar26) {
        uVar6 = uVar26;
      }
      uVar25 = (ulong)uVar6;
      if (uVar26 != 0) {
        uVar6 = 0xffffffff;
        do {
          uVar24 = (uint)uVar25;
          uVar25 = uVar25 / 10;
          uVar6 = uVar6 + 1;
        } while (9 < uVar24);
      }
      uVar5 = piVar18[(ulong)uVar5 + 1];
      uVar24 = -uVar5;
      if (0 < (int)uVar5) {
        uVar24 = uVar5;
      }
      uVar25 = (ulong)uVar24;
      if (uVar5 != 0) {
        uVar24 = 0xffffffff;
        do {
          uVar28 = (uint)uVar25;
          uVar25 = uVar25 / 10;
          uVar24 = uVar24 + 1;
        } while (9 < uVar28);
      }
      pcVar21 = "       ";
      if (p->fSmtLib == 0) {
        if ((long)(p->vSigns).nSize <= (long)uVar22) goto LAB_0038c389;
        pcVar21 = "signed ";
        if ((p->vSigns).pArray[uVar22] == '\0') {
          pcVar21 = "       ";
        }
      }
      sprintf(Range,"%s[%d:%d]%*s",pcVar21,(ulong)uVar26,(ulong)uVar5,
              (ulong)(6 - (uVar6 + uVar24 + (-((int)uVar5 >> 0x1f) - ((int)uVar26 >> 0x1f)))),"");
      fwrite("  ",2,1,(FILE *)pFile);
      if ((long)(p->vTypes).nSize <= (long)uVar22) {
LAB_0038c36a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar29 = (p->vTypes).pArray[uVar22];
      pcVar21 = "       ";
      if (iVar29 == 4) {
        pcVar21 = "output ";
      }
      if (iVar29 == 3) {
        pcVar21 = "input  ";
      }
      fwrite(pcVar21,7,1,(FILE *)pFile);
      if ((long)(p->vTypes).nSize <= (long)uVar22) goto LAB_0038c36a;
      iVar29 = (p->vTypes).pArray[uVar22];
      iVar8 = (int)uVar22;
      if (0xfffffffd < iVar29 - 5U) {
        pcVar21 = Wln_ObjName(p,iVar8);
        fprintf((FILE *)pFile,"wire %s %s ;\n",Range,pcVar21);
        if ((long)(p->vTypes).nSize <= (long)uVar22) goto LAB_0038c36a;
        if ((p->vTypes).pArray[uVar22] != 3) {
          fwrite("  assign                         ",0x21,1,(FILE *)pFile);
          pcVar21 = Wln_ObjName(p,iVar8);
          paVar9 = &p->vFanins[uVar22].field_2;
          if (2 < p->vFanins[uVar22].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          pcVar16 = Wln_ObjName(p,paVar9->Array[0]);
          fprintf((FILE *)pFile,"%-16s = %s ;\n",pcVar21,pcVar16);
        }
        goto LAB_0038b472;
      }
      pcVar21 = "wire %s ";
      if (iVar29 - 0x2bU < 2) {
        pcVar21 = "reg  %s ";
      }
      fprintf((FILE *)pFile,pcVar21,Range);
      if ((long)(p->vTypes).nSize <= (long)uVar22) goto LAB_0038c36a;
      iVar29 = (p->vTypes).pArray[uVar22];
      if (0x4a < iVar29) {
        if (0x60 < iVar29) {
          if (iVar29 != 0x61) {
            if (iVar29 == 0x62) {
              pcVar21 = Wln_ObjName(p,iVar8);
              fprintf((FILE *)pFile,"%s ;\n",pcVar21);
              fwrite("         ",9,1,(FILE *)pFile);
              fwrite("assign ",7,1,(FILE *)pFile);
              pcVar21 = Wln_ObjName(p,iVar8);
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              pcVar16 = Wln_ObjName(p,paVar9->Array[0]);
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              pcVar10 = Wln_ObjName(p,paVar9[1].Array[0]);
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              pcVar11 = Wln_ObjName(p,*(int *)((long)paVar9 + 0xc));
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              pcVar12 = Wln_ObjName(p,paVar9->Array[1]);
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              pcVar13 = Wln_ObjName(p,paVar9[1].Array[0]);
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              pcVar14 = Wln_ObjName(p,*(int *)((long)paVar9 + 0xc));
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              pcVar15 = Wln_ObjName(p,paVar9->Array[1]);
              fprintf((FILE *)pFile,"%s = %s ? %s + %s + %s : %s - %s - %s ;\n",pcVar21,pcVar16,
                      pcVar10,pcVar11,pcVar12,pcVar13,pcVar14,pcVar15);
              goto LAB_0038b472;
            }
            goto LAB_0038b25b;
          }
          pcVar21 = Wln_ObjName(p,iVar8);
          pcVar16 = Wln_ObjConstString(p,iVar8);
          fprintf((FILE *)pFile,"%-16s = %s",pcVar21,pcVar16);
          goto LAB_0038b41d;
        }
        if (iVar29 == 0x4b) {
          pcVar21 = Wln_ObjName(p,iVar8);
          fprintf((FILE *)pFile,"%s ;           LUT",pcVar21);
          paVar9 = &p->vFanins[uVar22].field_2;
          if (2 < p->vFanins[uVar22].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
          fprintf((FILE *)pFile," lut%d (%s, ",uVar22 & 0xffffffff,pcVar21);
          pWVar17 = p->vFanins;
          uVar25 = (ulong)(uint)pWVar17[uVar22].nSize;
          if (1 < pWVar17[uVar22].nSize) {
            lVar30 = 1;
            lVar23 = lVar27;
            do {
              if ((int)uVar25 < 3) {
                piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
              }
              else {
                piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
              }
              pcVar21 = Wln_ObjName(p,*piVar18);
              fprintf((FILE *)pFile,"%s, ",pcVar21);
              lVar30 = lVar30 + 1;
              pWVar17 = p->vFanins;
              uVar25 = (ulong)pWVar17[uVar22].nSize;
              lVar23 = lVar23 + 4;
            } while (lVar30 < (long)uVar25);
          }
        }
        else {
          if (iVar29 != 0x4d) goto LAB_0038b25b;
          pcVar21 = Wln_ObjName(p,iVar8);
          paVar9 = &p->vFanins[uVar22].field_2;
          if (2 < p->vFanins[uVar22].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          fprintf((FILE *)pFile,"%s ;              table%d",pcVar21,(ulong)(uint)paVar9->Array[1]);
          paVar9 = &p->vFanins[uVar22].field_2;
          if (2 < p->vFanins[uVar22].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
          fprintf((FILE *)pFile," s%d_Index(%s, ",uVar22 & 0xffffffff,pcVar21);
        }
        pcVar21 = Wln_ObjName(p,iVar8);
        pcVar16 = "%s)";
        goto LAB_0038ab09;
      }
      if (iVar29 < 0x48) {
        if (iVar29 == 0x2b) {
          pcVar21 = Wln_ObjName(p,iVar8);
          fprintf((FILE *)pFile,"%s ;\n",pcVar21);
          fwrite("         ",9,1,(FILE *)pFile);
          fwrite("always @( ",10,1,(FILE *)pFile);
          pWVar17 = p->vFanins;
          uVar25 = (ulong)(uint)pWVar17[uVar22].nSize;
          if (0 < pWVar17[uVar22].nSize) {
            lVar30 = 0;
            lVar23 = local_d0;
            do {
              if ((int)uVar25 < 3) {
                piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
              }
              else {
                piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
              }
              if (*piVar18 != 0) {
                pcVar21 = " or ";
                if (lVar30 == 0) {
                  pcVar21 = "";
                }
                if ((int)uVar25 < 3) {
                  piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
                }
                else {
                  piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
                }
                pcVar16 = Wln_ObjName(p,*piVar18);
                fprintf((FILE *)pFile,"%s%s",pcVar21,pcVar16);
              }
              lVar30 = lVar30 + 1;
              pWVar17 = p->vFanins;
              uVar25 = (ulong)pWVar17[uVar22].nSize;
              lVar23 = lVar23 + 4;
            } while (lVar30 < (long)uVar25);
          }
          fwrite(" )\n",3,1,(FILE *)pFile);
          fwrite("           ",0xb,1,(FILE *)pFile);
          fwrite("begin\n",6,1,(FILE *)pFile);
          fwrite("             ",0xd,1,(FILE *)pFile);
          paVar9 = &p->vFanins[uVar22].field_2;
          if (2 < p->vFanins[uVar22].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
          fprintf((FILE *)pFile,"case ( %s )\n",pcVar21);
          pWVar17 = p->vFanins;
          uVar25 = (ulong)(uint)pWVar17[uVar22].nSize;
          if (0 < pWVar17[uVar22].nSize) {
            lVar30 = 0;
            lVar23 = local_d0;
            do {
              if ((int)uVar25 < 3) {
                piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
              }
              else {
                piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
              }
              if ((lVar30 != 0) && (*piVar18 != 0)) {
                fwrite("               ",0xf,1,(FILE *)pFile);
                pcVar21 = Wln_ObjName(p,iVar8);
                fprintf((FILE *)pFile,"%d : %s = ",(ulong)((int)lVar30 - 1),pcVar21);
                pWVar17 = p->vFanins;
                if (pWVar17[uVar22].nSize < 3) {
                  piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
                }
                else {
                  piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
                }
                pcVar21 = Wln_ObjName(p,*piVar18);
                fprintf((FILE *)pFile,"%s ;\n",pcVar21);
              }
              lVar30 = lVar30 + 1;
              pWVar17 = p->vFanins;
              uVar25 = (ulong)pWVar17[uVar22].nSize;
              lVar23 = lVar23 + 4;
            } while (lVar30 < (long)uVar25);
          }
        }
        else {
          if (iVar29 != 0x2c) {
            if (iVar29 == 0x30) {
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              iVar29 = paVar9->Array[0];
              if (((long)iVar29 < 0) || (iVar19 = (p->vRanges).nSize, iVar19 <= iVar29))
              goto LAB_0038c36a;
              piVar18 = (p->vRanges).pArray;
              iVar29 = piVar18[iVar29];
              if (iVar29 < 0) goto LAB_0038c34b;
              pVVar3 = p->pRanges->vObjs;
              uVar5 = iVar29 * 4;
              iVar29 = pVVar3->nSize;
              if (iVar29 <= (int)uVar5) goto LAB_0038c34b;
              piVar4 = pVVar3->pArray;
              iVar1 = piVar4[uVar5];
              iVar2 = piVar4[(ulong)uVar5 + 1];
              uVar26 = iVar1 - iVar2;
              uVar5 = -uVar26;
              if (0 < (int)uVar26) {
                uVar5 = uVar26;
              }
              if ((long)iVar19 <= (long)uVar22) goto LAB_0038c36a;
              iVar19 = piVar18[uVar22];
              if ((iVar19 < 0) || (uVar6 = iVar19 * 4, iVar29 <= (int)uVar6)) goto LAB_0038c34b;
              iVar19 = piVar4[uVar6] - piVar4[(ulong)uVar6 + 1];
              iVar29 = -iVar19;
              if (0 < iVar19) {
                iVar29 = iVar19;
              }
              if (2 << ((byte)uVar5 & 0x1f) != iVar29 + 1) {
                __assert_fail("(1 << nRange) == Wln_ObjRange(p, iObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnWriteVer.c"
                              ,0x111,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
              }
              pcVar21 = Wln_ObjName(p,iVar8);
              fprintf((FILE *)pFile,"%s ;\n",pcVar21);
              if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
              uVar6 = iVar2 - iVar1;
              uVar5 = -uVar6;
              if (0 < (int)uVar6) {
                uVar5 = uVar6;
              }
              uVar24 = uVar26;
              if ((int)uVar26 < (int)uVar6) {
                uVar24 = uVar6;
              }
              uVar28 = 0;
              while( true ) {
                iVar29 = (p->vRanges).pArray[uVar22];
                if (iVar29 < 0) goto LAB_0038c34b;
                pVVar3 = p->pRanges->vObjs;
                uVar7 = iVar29 * 4;
                if (pVVar3->nSize <= (int)uVar7) goto LAB_0038c34b;
                piVar18 = pVVar3->pArray;
                uVar20 = piVar18[uVar7] - piVar18[(ulong)uVar7 + 1];
                uVar7 = -uVar20;
                if (0 < (int)uVar20) {
                  uVar7 = uVar20;
                }
                fwrite("         ",9,1,(FILE *)pFile);
                if (uVar7 < uVar28) break;
                fwrite("wire ",5,1,(FILE *)pFile);
                pcVar21 = Wln_ObjName(p,iVar8);
                fprintf((FILE *)pFile,"%s_",pcVar21);
                iVar29 = uVar5 + 1;
                uVar7 = uVar24;
                do {
                  fprintf((FILE *)pFile,"%d",(ulong)((uVar28 >> (uVar7 & 0x1f) & 1) != 0));
                  uVar7 = uVar7 - 1;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
                fwrite(" = ",3,1,(FILE *)pFile);
                uVar7 = 0;
                do {
                  uVar20 = uVar24 + uVar7;
                  bVar32 = uVar7 == 0;
                  uVar7 = uVar7 - 1;
                  pcVar21 = " & ";
                  if (bVar32) {
                    pcVar21 = "";
                  }
                  pcVar16 = "\r\n\t ";
                  if ((uVar28 >> (uVar20 & 0x1f) & 1) == 0) {
                    pcVar16 = " & ~";
                  }
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar10 = Wln_ObjName(p,paVar9->Array[0]);
                  fprintf((FILE *)pFile,"%s%s%s[%d]",pcVar21,pcVar16 + 3,pcVar10,(ulong)uVar20);
                } while (~uVar5 != uVar7);
                fwrite(" ;\n",3,1,(FILE *)pFile);
                uVar28 = uVar28 + 1;
                if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
              }
              pcVar21 = Wln_ObjName(p,iVar8);
              fprintf((FILE *)pFile,"assign %s = { ",pcVar21);
              if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
              iVar29 = (p->vRanges).pArray[uVar22];
              if (iVar29 < 0) goto LAB_0038c34b;
              pVVar3 = p->pRanges->vObjs;
              uVar24 = iVar29 * 4;
              if (pVVar3->nSize <= (int)uVar24) goto LAB_0038c34b;
              piVar18 = pVVar3->pArray;
              uVar28 = piVar18[uVar24] - piVar18[(ulong)uVar24 + 1];
              uVar24 = -uVar28;
              if (0 < (int)uVar28) {
                uVar24 = uVar28;
              }
              uVar28 = uVar24 + 1;
              if ((int)uVar26 < (int)uVar6) {
                uVar26 = uVar6;
              }
              do {
                if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
                iVar29 = (p->vRanges).pArray[uVar22];
                if (iVar29 < 0) goto LAB_0038c34b;
                pVVar3 = p->pRanges->vObjs;
                uVar6 = iVar29 * 4;
                if (pVVar3->nSize <= (int)uVar6) goto LAB_0038c34b;
                piVar18 = pVVar3->pArray;
                iVar19 = piVar18[uVar6] - piVar18[(ulong)uVar6 + 1];
                iVar29 = -iVar19;
                if (0 < iVar19) {
                  iVar29 = iVar19;
                }
                pcVar21 = "    \"%s\", ";
                if (iVar29 < (int)uVar28) {
                  pcVar21 = "T = %d\t\t";
                }
                pcVar16 = Wln_ObjName(p,iVar8);
                fprintf((FILE *)pFile,"%s%s_",pcVar21 + 8,pcVar16);
                uVar6 = uVar26;
                iVar29 = uVar5 + 1;
                do {
                  fprintf((FILE *)pFile,"%d",(ulong)((uVar24 >> (uVar6 & 0x1f) & 1) != 0));
                  uVar6 = uVar6 - 1;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
                bVar32 = 0 < (int)uVar24;
                uVar28 = uVar24;
                uVar24 = uVar24 - 1;
              } while (bVar32);
              fwrite(" } ;\n",5,1,(FILE *)pFile);
              goto LAB_0038b472;
            }
            goto LAB_0038b25b;
          }
          pcVar21 = Wln_ObjName(p,iVar8);
          fprintf((FILE *)pFile,"%s ;\n",pcVar21);
          fwrite("         ",9,1,(FILE *)pFile);
          fwrite("always @( ",10,1,(FILE *)pFile);
          pWVar17 = p->vFanins;
          uVar25 = (ulong)(uint)pWVar17[uVar22].nSize;
          if (0 < pWVar17[uVar22].nSize) {
            lVar30 = 0;
            lVar23 = local_d0;
            do {
              if ((int)uVar25 < 3) {
                piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
              }
              else {
                piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
              }
              if (*piVar18 != 0) {
                pcVar21 = " or ";
                if (lVar30 == 0) {
                  pcVar21 = "";
                }
                if ((int)uVar25 < 3) {
                  piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
                }
                else {
                  piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
                }
                pcVar16 = Wln_ObjName(p,*piVar18);
                fprintf((FILE *)pFile,"%s%s",pcVar21,pcVar16);
              }
              lVar30 = lVar30 + 1;
              pWVar17 = p->vFanins;
              uVar25 = (ulong)pWVar17[uVar22].nSize;
              lVar23 = lVar23 + 4;
            } while (lVar30 < (long)uVar25);
          }
          fwrite(" )\n",3,1,(FILE *)pFile);
          fwrite("           ",0xb,1,(FILE *)pFile);
          fwrite("begin\n",6,1,(FILE *)pFile);
          fwrite("             ",0xd,1,(FILE *)pFile);
          paVar9 = &p->vFanins[uVar22].field_2;
          if (2 < p->vFanins[uVar22].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
          fprintf((FILE *)pFile,"case ( %s )\n",pcVar21);
          pWVar17 = p->vFanins;
          uVar25 = (ulong)(uint)pWVar17[uVar22].nSize;
          if (0 < pWVar17[uVar22].nSize) {
            uVar31 = 0;
            do {
              paVar9 = &pWVar17[uVar22].field_2;
              if (2 < (int)uVar25) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              if ((uVar31 != 0) && (paVar9->Array[uVar31] != 0)) {
                fwrite("               ",0xf,1,(FILE *)pFile);
                fprintf((FILE *)pFile,"%d\'b",(ulong)(p->vFanins[uVar22].nSize - 1));
                iVar29 = p->vFanins[uVar22].nSize;
                if (1 < iVar29) {
                  iVar19 = iVar29 + 1;
                  uVar25 = (ulong)(iVar29 - 1);
                  do {
                    fprintf((FILE *)pFile,"%d",(ulong)(uVar31 == uVar25));
                    iVar19 = iVar19 + -1;
                    uVar25 = uVar25 - 1;
                  } while (2 < iVar19);
                }
                pcVar21 = Wln_ObjName(p,iVar8);
                fprintf((FILE *)pFile," : %s = ",pcVar21);
                paVar9 = &p->vFanins[uVar22].field_2;
                if (2 < p->vFanins[uVar22].nSize) {
                  paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                }
                pcVar21 = Wln_ObjName(p,paVar9->Array[uVar31]);
                fprintf((FILE *)pFile,"%s ;\n",pcVar21);
              }
              uVar31 = uVar31 + 1;
              pWVar17 = p->vFanins;
              uVar25 = (ulong)pWVar17[uVar22].nSize;
            } while ((long)uVar31 < (long)uVar25);
          }
          fwrite("               ",0xf,1,(FILE *)pFile);
          fwrite("default",7,1,(FILE *)pFile);
          pcVar21 = Wln_ObjName(p,iVar8);
          fprintf((FILE *)pFile," : %s = ",pcVar21);
          if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
          iVar29 = (p->vRanges).pArray[uVar22];
          if (iVar29 < 0) goto LAB_0038c34b;
          pVVar3 = p->pRanges->vObjs;
          uVar5 = iVar29 * 4;
          if (pVVar3->nSize <= (int)uVar5) goto LAB_0038c34b;
          piVar18 = pVVar3->pArray;
          iVar8 = piVar18[uVar5] - piVar18[(ulong)uVar5 + 1];
          iVar29 = -iVar8;
          if (0 < iVar8) {
            iVar29 = iVar8;
          }
          fprintf((FILE *)pFile,"%d\'b",(ulong)(iVar29 + 1));
          if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
          iVar29 = (p->vRanges).pArray[uVar22];
          if (iVar29 < 0) goto LAB_0038c34b;
          pVVar3 = p->pRanges->vObjs;
          uVar5 = iVar29 * 4;
          if (pVVar3->nSize <= (int)uVar5) goto LAB_0038c34b;
          piVar18 = pVVar3->pArray;
          iVar29 = piVar18[uVar5];
          iVar8 = piVar18[(ulong)uVar5 + 1];
          iVar19 = iVar29 - iVar8;
          iVar8 = iVar8 - iVar29;
          if (iVar8 <= iVar19) {
            iVar8 = iVar19;
          }
          iVar8 = iVar8 + 2;
          do {
            fprintf((FILE *)pFile,"%d",0);
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
          fwrite(" ;\n",3,1,(FILE *)pFile);
        }
        fwrite("             ",0xd,1,(FILE *)pFile);
        fwrite("endcase\n",8,1,(FILE *)pFile);
        fwrite("           ",0xb,1,(FILE *)pFile);
        fwrite("end\n",4,1,(FILE *)pFile);
      }
      else {
        if (iVar29 - 0x48U < 2) {
          paVar9 = &p->vFanins[uVar22].field_2;
          if (2 < p->vFanins[uVar22].nSize) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
          }
          if ((long)(p->vRanges).nSize <= (long)uVar22) goto LAB_0038c36a;
          iVar29 = (p->vRanges).pArray[uVar22];
          if (iVar29 < 0) {
LAB_0038c34b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          pVVar3 = p->pRanges->vObjs;
          uVar5 = iVar29 * 4;
          if (pVVar3->nSize <= (int)uVar5) goto LAB_0038c34b;
          uVar26 = paVar9->Array[1];
          piVar18 = pVVar3->pArray;
          iVar19 = piVar18[uVar5] - piVar18[(ulong)uVar5 + 1];
          iVar29 = -iVar19;
          if (0 < iVar19) {
            iVar29 = iVar19;
          }
          if (((int)uVar26 < 1) || (iVar29 < (int)uVar26)) {
            __assert_fail("Num0 > 0 && Num0 < Wln_ObjRange(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnWriteVer.c"
                          ,0xcb,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
          }
          pcVar21 = Wln_ObjName(p,iVar8);
          fprintf((FILE *)pFile,"%-16s = ",pcVar21);
          if ((long)(p->vTypes).nSize <= (long)uVar22) goto LAB_0038c36a;
          paVar9 = &p->vFanins[uVar22].field_2;
          if ((p->vTypes).pArray[uVar22] == 0x49) {
            if (2 < *(int *)((long)paVar9 + -4)) {
              paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
            }
            pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
            paVar9 = &p->vFanins[uVar22].field_2;
            if (2 < p->vFanins[uVar22].nSize) {
              paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
            }
            pcVar16 = Wln_ObjName(p,paVar9->Array[0]);
            pcVar10 = "(%s >> %d) | (%s << %d)";
          }
          else {
            if (2 < *(int *)((long)paVar9 + -4)) {
              paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
            }
            pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
            paVar9 = &p->vFanins[uVar22].field_2;
            if (2 < p->vFanins[uVar22].nSize) {
              paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
            }
            pcVar16 = Wln_ObjName(p,paVar9->Array[0]);
            pcVar10 = "(%s << %d) | (%s >> %d)";
          }
          fprintf((FILE *)pFile,pcVar10,pcVar21,(ulong)uVar26,pcVar16,(ulong)((iVar29 - uVar26) + 1)
                 );
          goto LAB_0038b41d;
        }
LAB_0038b25b:
        iVar29 = Wln_ObjType(p,iVar8);
        if ((iVar29 == 0x50) || (iVar29 = Wln_ObjType(p,iVar8), iVar29 == 0x51)) {
          pcVar21 = Wln_ObjName(p,iVar8);
          fprintf((FILE *)pFile,"%s ;\n",pcVar21);
          fwrite("         ",9,1,(FILE *)pFile);
          iVar29 = Wln_ObjType(p,iVar8);
          pcVar21 = "ABC_WRITE";
          if (iVar29 == 0x50) {
            pcVar21 = "ABC_READ";
          }
          fprintf((FILE *)pFile,"%s (",pcVar21);
          pWVar17 = p->vFanins;
          uVar25 = (ulong)(uint)pWVar17[uVar22].nSize;
          if (0 < pWVar17[uVar22].nSize) {
            lVar30 = 0;
            lVar23 = local_d0;
            do {
              if ((int)uVar25 < 3) {
                piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
              }
              else {
                piVar18 = pWVar17[uVar22].field_2.pArray[0] + lVar30;
              }
              if (*piVar18 != 0) {
                pcVar21 = "data";
                if (lVar30 == 1) {
                  pcVar21 = "addr";
                }
                if (lVar30 == 0) {
                  pcVar21 = "mem_in";
                }
                pcVar16 = Wln_ObjName(p,*piVar18);
                fprintf((FILE *)pFile," .%s(%s),",pcVar21,pcVar16);
              }
              lVar30 = lVar30 + 1;
              pWVar17 = p->vFanins;
              uVar25 = (ulong)pWVar17[uVar22].nSize;
              lVar23 = lVar23 + 4;
            } while (lVar30 < (long)uVar25);
          }
          iVar29 = Wln_ObjType(p,iVar8);
          pcVar21 = "mem_out";
          if (iVar29 == 0x50) {
            pcVar21 = "data";
          }
          pcVar16 = Wln_ObjName(p,iVar8);
          fprintf((FILE *)pFile," .%s(%s) ) ;\n",pcVar21,pcVar16);
        }
        else {
          iVar29 = Wln_ObjType(p,iVar8);
          pcVar21 = Wln_ObjName(p,iVar8);
          if (iVar29 == 0x59) {
            fprintf((FILE *)pFile,"%s ;\n",pcVar21);
          }
          else {
            fprintf((FILE *)pFile,"%-16s = ",pcVar21);
            iVar29 = Wln_ObjType(p,iVar8);
            if (iVar29 == 0xb) {
              paVar9 = &p->vFanins[uVar22].field_2;
              if (2 < p->vFanins[uVar22].nSize) {
                paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
              }
              iVar29 = paVar9->Array[0];
LAB_0038b720:
              pcVar21 = Wln_ObjName(p,iVar29);
              fputs(pcVar21,(FILE *)pFile);
            }
            else {
              iVar29 = Wln_ObjType(p,iVar8);
              if (iVar29 == 0x15) {
                paVar9 = &p->vFanins[uVar22].field_2;
                if (2 < p->vFanins[uVar22].nSize) {
                  paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                }
                pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                fprintf((FILE *)pFile,"%s ? ",pcVar21);
                paVar9 = &p->vFanins[uVar22].field_2;
                if (2 < p->vFanins[uVar22].nSize) {
                  paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                }
                pcVar21 = Wln_ObjName(p,paVar9->Array[1]);
                fprintf((FILE *)pFile,"%s : ",pcVar21);
                paVar9 = &p->vFanins[uVar22].field_2;
                if (2 < p->vFanins[uVar22].nSize) {
                  paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                }
                iVar29 = paVar9[1].Array[0];
                goto LAB_0038b720;
              }
              iVar29 = Wln_ObjType(p,iVar8);
              if (iVar29 == 0x3a) {
                paVar9 = &p->vFanins[uVar22].field_2;
                if (2 < p->vFanins[uVar22].nSize) {
                  paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                }
                pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                pcVar16 = "-%s";
LAB_0038ab09:
                fprintf((FILE *)pFile,pcVar16,pcVar21);
              }
              else {
                iVar29 = Wln_ObjType(p,iVar8);
                if (iVar29 == 0xc) {
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                  pcVar16 = "~%s";
                  goto LAB_0038ab09;
                }
                iVar29 = Wln_ObjType(p,iVar8);
                if (iVar29 == 0x24) {
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                  pcVar16 = "!%s";
                  goto LAB_0038ab09;
                }
                iVar29 = Wln_ObjType(p,iVar8);
                if (iVar29 == 0x1e) {
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                  pcVar16 = "&%s";
                  goto LAB_0038ab09;
                }
                iVar29 = Wln_ObjType(p,iVar8);
                if (iVar29 == 0x20) {
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                  pcVar16 = "|%s";
                  goto LAB_0038ab09;
                }
                iVar29 = Wln_ObjType(p,iVar8);
                if (iVar29 == 0x22) {
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                  pcVar16 = "^%s";
                  goto LAB_0038ab09;
                }
                iVar29 = Wln_ObjType(p,iVar8);
                if (iVar29 == 0x1f) {
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                  pcVar16 = "~&%s";
                  goto LAB_0038ab09;
                }
                iVar29 = Wln_ObjType(p,iVar8);
                if (iVar29 == 0x21) {
                  paVar9 = &p->vFanins[uVar22].field_2;
                  if (2 < p->vFanins[uVar22].nSize) {
                    paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                  }
                  pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                  pcVar16 = "~|%s";
LAB_0038b99f:
                  fprintf((FILE *)pFile,pcVar16,pcVar21);
                }
                else {
                  iVar29 = Wln_ObjType(p,iVar8);
                  if (iVar29 == 0x23) {
                    paVar9 = &p->vFanins[uVar22].field_2;
                    if (2 < p->vFanins[uVar22].nSize) {
                      paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                    }
                    pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                    pcVar16 = "~^%s";
                    goto LAB_0038b99f;
                  }
                  iVar29 = Wln_ObjType(p,iVar8);
                  if (iVar29 == 0x5b) {
                    paVar9 = &p->vFanins[uVar22].field_2;
                    if (2 < p->vFanins[uVar22].nSize) {
                      paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                    }
                    pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                    uVar5 = Wln_ObjRangeEnd(p,iVar8);
                    uVar26 = Wln_ObjRangeBeg(p,iVar8);
                    fprintf((FILE *)pFile,"%s [%d:%d]",pcVar21,(ulong)uVar5,(ulong)uVar26);
                  }
                  else {
                    iVar29 = Wln_ObjType(p,iVar8);
                    if (iVar29 == 0x5e) {
                      iVar29 = Wln_ObjRange(p,iVar8);
                      paVar9 = &p->vFanins[uVar22].field_2;
                      if (2 < p->vFanins[uVar22].nSize) {
                        paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                      }
                      iVar8 = Wln_ObjRange(p,paVar9->Array[0]);
                      paVar9 = &p->vFanins[uVar22].field_2;
                      if (2 < p->vFanins[uVar22].nSize) {
                        paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                      }
                      pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                      paVar9 = &p->vFanins[uVar22].field_2;
                      if (2 < p->vFanins[uVar22].nSize) {
                        paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                      }
                      iVar19 = Wln_ObjRange(p,paVar9->Array[0]);
                      paVar9 = &p->vFanins[uVar22].field_2;
                      if (2 < p->vFanins[uVar22].nSize) {
                        paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                      }
                      pcVar16 = Wln_ObjName(p,paVar9->Array[0]);
                      fprintf((FILE *)pFile,"{ {%d{%s[%d]}}, %s }",(ulong)(uint)(iVar29 - iVar8),
                              pcVar21,(ulong)(iVar19 - 1),pcVar16);
                    }
                    else {
                      iVar29 = Wln_ObjType(p,iVar8);
                      if (iVar29 == 0x5d) {
                        iVar29 = Wln_ObjRange(p,iVar8);
                        paVar9 = &p->vFanins[uVar22].field_2;
                        if (2 < p->vFanins[uVar22].nSize) {
                          paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                        }
                        iVar8 = Wln_ObjRange(p,paVar9->Array[0]);
                        paVar9 = &p->vFanins[uVar22].field_2;
                        if (2 < p->vFanins[uVar22].nSize) {
                          paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                        }
                        pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                        fprintf((FILE *)pFile,"{ {%d{1\'b0}}, %s }",(ulong)(uint)(iVar29 - iVar8),
                                pcVar21);
                      }
                      else {
                        iVar29 = Wln_ObjType(p,iVar8);
                        if (iVar29 == 0x5c) {
                          fputc(0x7b,(FILE *)pFile);
                          pWVar17 = p->vFanins;
                          uVar25 = (ulong)(uint)pWVar17[uVar22].nSize;
                          if (0 < pWVar17[uVar22].nSize) {
                            uVar31 = 0;
                            lVar23 = local_d0;
                            do {
                              if ((int)uVar25 < 3) {
                                piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
                              }
                              else {
                                piVar18 = pWVar17[uVar22].field_2.pArray[0] + uVar31;
                              }
                              if (*piVar18 != 0) {
                                if ((int)uVar25 < 3) {
                                  piVar18 = (int *)((long)&pWVar17->nCap + lVar23);
                                }
                                else {
                                  piVar18 = pWVar17[uVar22].field_2.pArray[0] + uVar31;
                                }
                                pcVar21 = Wln_ObjName(p,*piVar18);
                                pcVar16 = ",";
                                if (uVar31 == p->vFanins[uVar22].nSize - 1) {
                                  pcVar16 = "";
                                }
                                fprintf((FILE *)pFile," %s%s",pcVar21,pcVar16);
                              }
                              uVar31 = uVar31 + 1;
                              pWVar17 = p->vFanins;
                              uVar25 = (ulong)pWVar17[uVar22].nSize;
                              lVar23 = lVar23 + 4;
                            } while ((long)uVar31 < (long)uVar25);
                          }
                          fwrite(" }",2,1,(FILE *)pFile);
                        }
                        else {
                          paVar9 = &p->vFanins[uVar22].field_2;
                          if (2 < p->vFanins[uVar22].nSize) {
                            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                          }
                          pcVar21 = Wln_ObjName(p,paVar9->Array[0]);
                          fprintf((FILE *)pFile,"%s ",pcVar21);
                          iVar29 = Wln_ObjType(p,iVar8);
                          if (iVar29 == 0x45) {
                            __size = 2;
                            pcVar21 = ">>";
LAB_0038bda2:
                            fwrite(pcVar21,__size,1,(FILE *)pFile);
                          }
                          else {
                            iVar29 = Wln_ObjType(p,iVar8);
                            if (iVar29 == 0x47) {
                              __size = 3;
                              pcVar21 = ">>>";
                              goto LAB_0038bda2;
                            }
                            iVar29 = Wln_ObjType(p,iVar8);
                            if (iVar29 == 0x44) {
                              __size = 2;
                              pcVar21 = "<<";
                              goto LAB_0038bda2;
                            }
                            iVar29 = Wln_ObjType(p,iVar8);
                            if (iVar29 == 0x46) {
                              __size = 3;
                              pcVar21 = "<<<";
                              goto LAB_0038bda2;
                            }
                            iVar29 = Wln_ObjType(p,iVar8);
                            if (iVar29 == 0xd) {
                              iVar29 = 0x26;
LAB_0038be98:
                              fputc(iVar29,(FILE *)pFile);
                            }
                            else {
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0xf) {
                                iVar29 = 0x7c;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x11) {
                                iVar29 = 0x5e;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0xe) {
                                __size = 2;
                                pcVar21 = "~&";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x10) {
                                __size = 2;
                                pcVar21 = "~|";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x12) {
                                __size = 2;
                                pcVar21 = "~^";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x5f) {
                                __size = 2;
                                pcVar21 = "=>";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x25) {
                                __size = 2;
                                pcVar21 = "&&";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x27) {
                                __size = 2;
                                pcVar21 = "||";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x29) {
                                __size = 2;
                                pcVar21 = "^^";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x42) {
                                __size = 2;
                                pcVar21 = "==";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x43) {
                                __size = 2;
                                pcVar21 = "!=";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x3e) {
                                iVar29 = 0x3c;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x41) {
                                iVar29 = 0x3e;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x3f) {
                                __size = 2;
                                pcVar21 = "<=";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x40) {
                                __size = 2;
                                pcVar21 = ">=";
                                goto LAB_0038bda2;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x32) {
                                iVar29 = 0x2b;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x33) {
                                iVar29 = 0x2d;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x34) {
                                iVar29 = 0x2a;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if (iVar29 == 0x36) {
                                iVar29 = 0x2f;
                                goto LAB_0038be98;
                              }
                              iVar29 = Wln_ObjType(p,iVar8);
                              if ((iVar29 != 0x38) &&
                                 (iVar29 = Wln_ObjType(p,iVar8), iVar29 != 0x37)) {
                                iVar29 = Wln_ObjType(p,iVar8);
                                if (iVar29 == 0x39) {
                                  __size = 2;
                                  pcVar21 = "**";
                                  goto LAB_0038bda2;
                                }
                                iVar29 = Wln_ObjType(p,iVar8);
                                if (iVar29 == 0x3b) {
                                  iVar29 = 0x40;
                                }
                                else {
                                  iVar29 = Wln_ObjType(p,iVar8);
                                  if (iVar29 != 0x60) {
                                    pcVar21 = Wln_ObjName(p,iVar8);
                                    uVar5 = Wln_ObjType(p,iVar8);
                                    printf("Failed to write node \"%s\" with unknown operator type (%d).\n"
                                           ,pcVar21,(ulong)uVar5);
                                    fwrite("???\n",4,1,(FILE *)pFile);
                                    goto LAB_0038b472;
                                  }
                                  iVar29 = 0x23;
                                }
                                goto LAB_0038be98;
                              }
                              fprintf((FILE *)pFile,"%%");
                            }
                          }
                          paVar9 = &p->vFanins[uVar22].field_2;
                          if (2 < p->vFanins[uVar22].nSize) {
                            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0];
                          }
                          pcVar21 = Wln_ObjName(p,paVar9->Array[1]);
                          fprintf((FILE *)pFile," %s",pcVar21);
                          if ((p->vFanins[uVar22].nSize == 3) &&
                             (iVar29 = Wln_ObjType(p,iVar8), iVar29 == 0x32)) {
                            paVar9 = &p->vFanins[uVar22].field_2;
                            if (2 < p->vFanins[uVar22].nSize) {
                              paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar9->pArray[0]
                              ;
                            }
                            pcVar21 = Wln_ObjName(p,paVar9[1].Array[0]);
                            pcVar16 = " + %s";
                            goto LAB_0038b99f;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_0038b41d:
            pcVar21 = "";
            if (p->fSmtLib != 0) {
              if ((long)(p->vSigns).nSize <= (long)uVar22) {
LAB_0038c389:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                              ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
              }
              pcVar21 = " // signed SMT-LIB operator";
              if ((p->vSigns).pArray[uVar22] == '\0') {
                pcVar21 = "";
              }
            }
            fprintf((FILE *)pFile," ;%s\n",pcVar21);
          }
        }
      }
LAB_0038b472:
      uVar22 = uVar22 + 1;
      local_d0 = local_d0 + 0x10;
      lVar27 = lVar27 + 0x10;
    } while ((long)uVar22 < (long)(p->vTypes).nSize);
  }
  fputc(10,(FILE *)pFile);
  if (0 < (p->vFfs).nSize) {
    lVar27 = 0;
    do {
      iVar29 = (p->vFfs).pArray[lVar27];
      fwrite("         ",9,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"%s (","ABC_DFFRSE");
      pWVar17 = p->vFanins;
      uVar22 = (ulong)(uint)pWVar17[iVar29].nSize;
      if (0 < pWVar17[iVar29].nSize) {
        lVar23 = 0;
        lVar30 = 0;
        do {
          if ((int)uVar22 < 3) {
            piVar18 = (int *)((long)&pWVar17[iVar29].field_2 + lVar23);
          }
          else {
            piVar18 = pWVar17[iVar29].field_2.pArray[0] + lVar30;
          }
          if (*piVar18 != 0) {
            iVar8 = *(int *)((long)&DAT_0099c5b8 + lVar23);
            pcVar21 = Wln_ObjName(p,*piVar18);
            fprintf((FILE *)pFile," .%s(%s),",(long)&DAT_0099c5b8 + (long)iVar8,pcVar21);
          }
          lVar30 = lVar30 + 1;
          pWVar17 = p->vFanins;
          uVar22 = (ulong)pWVar17[iVar29].nSize;
          lVar23 = lVar23 + 4;
        } while (lVar30 < (long)uVar22);
      }
      pcVar21 = Wln_ObjName(p,iVar29);
      fprintf((FILE *)pFile," .%s(%s) ) ;\n","q",pcVar21);
      lVar27 = lVar27 + 1;
    } while (lVar27 < (p->vFfs).nSize);
  }
  fputc(10,(FILE *)pFile);
  fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
  return;
}

Assistant:

void Wln_WriteVerInt( FILE * pFile, Wln_Ntk_t * p )
{
    int k, j, iObj, iFanin;
    char Range[100];
    fprintf( pFile, "module %s ( ", p->pName );
    fprintf( pFile, "\n   " );
    if ( Wln_NtkCiNum(p) > 0 )
    {
        Wln_WriteVerIntVec( pFile, p, &p->vCis, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Wln_NtkCoNum(p) > 0 )
        Wln_WriteVerIntVec( pFile, p, &p->vCos, 3 );
    fprintf( pFile, "  );\n" );
    Wln_NtkForEachObj( p, iObj )
    {
        int End = Wln_ObjRangeEnd(p, iObj);
        int Beg = Wln_ObjRangeBeg(p, iObj);
        int nDigits = Abc_Base10Log(Abc_AbsInt(End)+1) + Abc_Base10Log(Abc_AbsInt(Beg)+1) + (int)(End < 0) + (int)(Beg < 0);
        sprintf( Range, "%s[%d:%d]%*s", (!p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? "signed ":"       ", End, Beg, 8-nDigits, "" );
        fprintf( pFile, "  " );
        if ( Wln_ObjIsCi(p, iObj) )
            fprintf( pFile, "input  " );
        else if ( Wln_ObjIsCo(p, iObj) )
            fprintf( pFile, "output " );
        else
            fprintf( pFile, "       " );
        if ( Wln_ObjIsCio(p, iObj) )
        {
            fprintf( pFile, "wire %s %s ;\n", Range, Wln_ObjName(p, iObj) );
            if ( Wln_ObjIsCi(p, iObj) )
                continue;
            fprintf( pFile, "  assign                         " );
            fprintf( pFile, "%-16s = %s ;\n", Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            continue;
        }
        if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX || Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
            fprintf( pFile, "reg  %s ", Range );
        else
            fprintf( pFile, "wire %s ", Range );
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
        {
            // wire [3:0] s4972; table0 s4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;              table%d", Wln_ObjName(p, iObj), Wln_ObjFanin1(p, iObj) );
            fprintf( pFile, " s%d_Index(%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_LUT )
        {
            // wire [3:0] s4972; LUT lut4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;           LUT", Wln_ObjName(p, iObj) );
            fprintf( pFile, " lut%d (%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            for ( k = 1; k < Wln_ObjFaninNum(p, iObj); k++ )
                fprintf( pFile, "%s, ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjIsConst(p, iObj) )
            fprintf( pFile, "%-16s = %s", Wln_ObjName(p, iObj), Wln_ObjConstString(p, iObj) );
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR || Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTL )
        {
            //  wire [27:0] s4960 = (s57 >> 17) | (s57 << 11);
            int Num0 = Wln_ObjFanin1(p, iObj);
            int Num1 = Wln_ObjRange(p, iObj) - Num0;
            assert( Num0 > 0 && Num0 < Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR )
                fprintf( pFile, "(%s >> %d) | (%s << %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
            else
                fprintf( pFile, "(%s << %d) | (%s >> %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d : %s = ", k-1, Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d\'b", Wln_ObjFaninNum(p, iObj)-1 );
                for ( j = Wln_ObjFaninNum(p, iObj)-1; j > 0; j-- )
                    fprintf( pFile, "%d", (int)(j==k) );
                fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "               " );
            fprintf( pFile, "default" );
            fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
            fprintf( pFile, "%d\'b", Wln_ObjRange(p, iObj) );
            for ( j = Wln_ObjRange(p, iObj)-1; j >= 0; j-- )
                fprintf( pFile, "%d", 0 );
            fprintf( pFile, " ;\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_DEC )
        {
            int nRange = Wln_ObjRange(p, Wln_ObjFanin0(p, iObj));
            assert( (1 << nRange) == Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            for ( k = 0; k < Wln_ObjRange(p, iObj); k++ )
            {
                fprintf( pFile, "         " );
                fprintf( pFile, "wire " );
                fprintf( pFile, "%s_", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
                fprintf( pFile, " = " );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%s%s%s[%d]", 
                        j ? " & ":"", ((k >> (nRange-1-j)) & 1) ? " ":"~", 
                        Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)), nRange-1-j );
                fprintf( pFile, " ;\n" );
            }
            fprintf( pFile, "         " );
            fprintf( pFile, "assign %s = { ", Wln_ObjName(p, iObj) );
            for ( k = Wln_ObjRange(p, iObj)-1; k >= 0; k-- )
            {
                fprintf( pFile, "%s%s_", k < Wln_ObjRange(p, iObj)-1 ? ", ":"", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
            }
            fprintf( pFile, " } ;\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADDSUB )
        {
            // out = mode ? a+b+cin : a-b-cin
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "assign " );
            fprintf( pFile, "%s = %s ? %s + %s + %s : %s - %s - %s ;\n", 
                        Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) 
                   );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_RAMR || Wln_ObjType(p, iObj) == ABC_OPER_RAMW )
        {
            if ( 1 )
            {
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "ABC_READ" : "ABC_WRITE" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_in" : (k==1 ? "addr": "data"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "data" : "mem_out", Wln_ObjName(p, iObj) );
                continue;
            }
            else
            {
                int nBitsMem  = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 0) );
                //int nBitsAddr = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 1) );
                int nBitsDat  = Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? Wln_ObjRange(p, iObj) : Wln_ObjRange(p, Wln_ObjFanin(p, iObj, 2));
                int Depth     = nBitsMem / nBitsDat;
                assert( nBitsMem % nBitsDat == 0 );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s_%d (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "CPL_MEM_READ" : "CPL_MEM_WRITE", Depth );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_data_in" : (k==1 ? "addr_in": "data_in"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", "data_out", Wln_ObjName(p, iObj) );
                continue;
            }
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_DFFRSE )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            continue;
        }
        else 
        {
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_BUF )
                fprintf( pFile, "%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_MUX )
            {
                fprintf( pFile, "%s ? ", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
                fprintf( pFile, "%s : ", Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) );
                fprintf( pFile, "%s",    Wln_ObjName(p, Wln_ObjFanin2(p, iObj)) );
            }
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MIN )
                fprintf( pFile, "-%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_INV )
                fprintf( pFile, "~%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_NOT )
                fprintf( pFile, "!%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_AND )
                fprintf( pFile, "&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_OR )
                fprintf( pFile, "|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_XOR )
                fprintf( pFile, "^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NAND )
                fprintf( pFile, "~&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NOR )
                fprintf( pFile, "~|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NXOR )
                fprintf( pFile, "~^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SLICE )
                fprintf( pFile, "%s [%d:%d]", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SIGNEXT )
                fprintf( pFile, "{ {%d{%s[%d]}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)) - 1, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ZEROPAD )
                fprintf( pFile, "{ {%d{1\'b0}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_CONCAT )
            {
                fprintf( pFile, "{" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " %s%s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)), k == Wln_ObjFaninNum(p, iObj)-1 ? "":"," );
                fprintf( pFile, " }" );
            }
            else
            {
                fprintf( pFile, "%s ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
                if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_R )
                    fprintf( pFile, ">>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_RA )
                    fprintf( pFile, ">>>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_L )
                    fprintf( pFile, "<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_LA )
                    fprintf( pFile, "<<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_AND )
                    fprintf( pFile, "&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_OR )
                    fprintf( pFile, "|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_XOR )
                    fprintf( pFile, "^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NAND )
                    fprintf( pFile, "~&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NOR )
                    fprintf( pFile, "~|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NXOR )
                    fprintf( pFile, "~^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_IMPL )
                    fprintf( pFile, "=>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_AND )
                    fprintf( pFile, "&&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_OR )
                    fprintf( pFile, "||" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_XOR )
                    fprintf( pFile, "^^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_EQU )
                    fprintf( pFile, "==" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_NOTEQU )
                    fprintf( pFile, "!=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESS )
                    fprintf( pFile, "<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MORE )
                    fprintf( pFile, ">" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESSEQU )
                    fprintf( pFile, "<=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MOREEQU )
                    fprintf( pFile, ">=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD )
                    fprintf( pFile, "+" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SUB )
                    fprintf( pFile, "-" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MUL )
                    fprintf( pFile, "*" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_DIV )
                    fprintf( pFile, "/" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_REM )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MOD )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_POW )
                    fprintf( pFile, "**" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQRT )
                    fprintf( pFile, "@" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQUARE )
                    fprintf( pFile, "#" );
                else 
                {
                    //assert( 0 );
                    printf( "Failed to write node \"%s\" with unknown operator type (%d).\n", Wln_ObjName(p, iObj), Wln_ObjType(p, iObj) );
                    fprintf( pFile, "???\n" );
                    continue;
                }
                fprintf( pFile, " %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 1)) );
                if ( Wln_ObjFaninNum(p, iObj) == 3 && Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD ) 
                    fprintf( pFile, " + %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 2)) );
            }
        }
        fprintf( pFile, " ;%s\n", (p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? " // signed SMT-LIB operator" : "" );
    }
    iFanin = 0;
    // write DFFs in the end
    fprintf( pFile, "\n" );
    Wln_NtkForEachFf( p, iObj, j )
    {
        char * pInNames[8] = {"d", "clk", "reset", "set", "enable", "async", "sre", "init"};
        fprintf( pFile, "         " );
        fprintf( pFile, "%s (", "ABC_DFFRSE" );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            if ( iFanin ) fprintf( pFile, " .%s(%s),", pInNames[k], Wln_ObjName(p, iFanin) );
        fprintf( pFile, " .%s(%s) ) ;\n", "q", Wln_ObjName(p, iObj) );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "endmodule\n\n" );
}